

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void print_debug_info(FILE *debug_file,aom_image_t *raw,aom_image_t *denoised,uint8_t *flat_blocks,
                     int block_size,aom_noise_model_t *noise_model)

{
  long lVar1;
  FILE *in_RDI;
  long in_R9;
  aom_film_grain_t grain;
  int k;
  aom_equation_system_t *eqns;
  int c;
  aom_film_grain_t *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  uint8_t *in_stack_fffffffffffffe38;
  aom_image_t *in_stack_fffffffffffffe40;
  aom_image_t *in_stack_fffffffffffffe48;
  FILE *in_stack_fffffffffffffe50;
  aom_film_grain_t *in_stack_fffffffffffffea0;
  aom_noise_model_t *in_stack_fffffffffffffea8;
  int local_44;
  uint local_34;
  
  fprintf(in_RDI,"figure(3); clf;\n");
  fprintf(in_RDI,"figure(2); clf;\n");
  fprintf(in_RDI,"figure(1); clf;\n");
  for (local_34 = 0; (int)local_34 < 3; local_34 = local_34 + 1) {
    fprintf(in_RDI,"noise_strength_%d = [\n",(ulong)local_34);
    lVar1 = in_R9 + (long)(int)local_34 * 0x70;
    for (local_44 = 0; local_44 < *(int *)(lVar1 + 0x48); local_44 = local_44 + 1) {
      fprintf(in_RDI,"%lf ",*(undefined8 *)(*(long *)(lVar1 + 0x40) + (long)local_44 * 8));
    }
    fprintf(in_RDI,"];\n");
    fprintf(in_RDI,"plot(noise_strength_%d); hold on;\n",(ulong)local_34);
  }
  fprintf(in_RDI,"legend(\'Y\', \'cb\', \'cr\');\n");
  fprintf(in_RDI,"title(\'Noise strength function\');\n");
  aom_noise_model_get_grain_parameters(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  print_variance_y(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                   in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,in_stack_fffffffffffffe28);
  fflush(in_RDI);
  return;
}

Assistant:

static void print_debug_info(FILE *debug_file, aom_image_t *raw,
                             aom_image_t *denoised, uint8_t *flat_blocks,
                             int block_size, aom_noise_model_t *noise_model) {
  (void)raw;
  (void)denoised;
  (void)flat_blocks;
  (void)block_size;
  fprintf(debug_file, "figure(3); clf;\n");
  fprintf(debug_file, "figure(2); clf;\n");
  fprintf(debug_file, "figure(1); clf;\n");
  for (int c = 0; c < 3; ++c) {
    fprintf(debug_file, "noise_strength_%d = [\n", c);
    const aom_equation_system_t *eqns =
        &noise_model->combined_state[c].strength_solver.eqns;
    for (int k = 0; k < eqns->n; ++k) {
      fprintf(debug_file, "%lf ", eqns->x[k]);
    }
    fprintf(debug_file, "];\n");
    fprintf(debug_file, "plot(noise_strength_%d); hold on;\n", c);
  }
  fprintf(debug_file, "legend('Y', 'cb', 'cr');\n");
  fprintf(debug_file, "title('Noise strength function');\n");

#if CONFIG_AV1_DECODER
  aom_film_grain_t grain;
  aom_noise_model_get_grain_parameters(noise_model, &grain);
  print_variance_y(debug_file, raw, denoised, flat_blocks, block_size, &grain);
#endif
  fflush(debug_file);
}